

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

void __thiscall
Diligent::GetBufferViewTypeLiteralName::BuffViewTypeToLiteralNameMap::BuffViewTypeToLiteralNameMap
          (BuffViewTypeToLiteralNameMap *this)

{
  reference ppcVar1;
  BuffViewTypeToLiteralNameMap *this_local;
  
  memset(this,0,0x18);
  ppcVar1 = std::array<const_char_*,_3UL>::operator[](&this->BuffViewLiteralNames,0);
  *ppcVar1 = "BUFFER_VIEW_UNDEFINED";
  ppcVar1 = std::array<const_char_*,_3UL>::operator[](&this->BuffViewLiteralNames,1);
  *ppcVar1 = "BUFFER_VIEW_SHADER_RESOURCE";
  ppcVar1 = std::array<const_char_*,_3UL>::operator[](&this->BuffViewLiteralNames,2);
  *ppcVar1 = "BUFFER_VIEW_UNORDERED_ACCESS";
  return;
}

Assistant:

BuffViewTypeToLiteralNameMap()
        {
            // clang-format off
#define INIT_BUFF_VIEW_TYPE_NAME(ViewType)BuffViewLiteralNames[ViewType] = #ViewType
            INIT_BUFF_VIEW_TYPE_NAME( BUFFER_VIEW_UNDEFINED );
            INIT_BUFF_VIEW_TYPE_NAME( BUFFER_VIEW_SHADER_RESOURCE );
            INIT_BUFF_VIEW_TYPE_NAME( BUFFER_VIEW_UNORDERED_ACCESS );
 #undef INIT_BUFF_VIEW_TYPE_NAME
            // clang-format on
            static_assert(BUFFER_VIEW_NUM_VIEWS == 3, "Not all buffer views names initialized.");
        }